

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

int parse_expression_list(ParserState *parser,AstNodeList **list)

{
  LexerState *ls;
  int iVar1;
  AstNode *node;
  
  ls = parser->ls;
  node = parse_expression(parser);
  while( true ) {
    add_ast_node(parser->compiler_state,list,node);
    iVar1 = testnext(ls,0x2c);
    if (iVar1 == 0) break;
    node = parse_expression(parser);
  }
  return 0;
}

Assistant:

static int parse_expression_list(ParserState *parser, AstNodeList **list)
{
	LexerState *ls = parser->ls;
	/* explist -> expr { ',' expr } */
	int n = 1; /* at least one expression */
	AstNode *expr = parse_expression(parser);
	add_ast_node(parser->compiler_state, list, expr);
	while (testnext(ls, ',')) {
		expr = parse_expression(parser);
		add_ast_node(parser->compiler_state, list, expr);
		n++;
	}
	return n;
}